

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linkValidate.cpp
# Opt level: O0

int glslang::TIntermediate::computeBufferReferenceTypeSize(TType *type)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  undefined4 extraout_var;
  uint local_14;
  int align;
  int size;
  TType *type_local;
  
  bVar1 = TType::isReference(type);
  if (!bVar1) {
    __assert_fail("type.isReference()",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/linkValidate.cpp"
                  ,0x9c5,
                  "static int glslang::TIntermediate::computeBufferReferenceTypeSize(const TType &)"
                 );
  }
  iVar2 = (*type->_vptr_TType[0x15])();
  local_14 = getBlockSize((TType *)CONCAT44(extraout_var,iVar2));
  uVar3 = TType::getBufferReferenceAlignment(type);
  if (uVar3 != 0) {
    local_14 = (local_14 + uVar3) - 1 & (uVar3 - 1 ^ 0xffffffff);
  }
  return local_14;
}

Assistant:

int TIntermediate::computeBufferReferenceTypeSize(const TType& type)
{
    assert(type.isReference());
    int size = getBlockSize(*type.getReferentType());

    int align = type.getBufferReferenceAlignment();

    if (align) {
        size = (size + align - 1) & ~(align-1);
    }

    return size;
}